

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O2

QString * __thiscall
QProcessEnvironment::value
          (QString *__return_storage_ptr__,QProcessEnvironment *this,QString *name,
          QString *defaultValue)

{
  QProcessEnvironmentPrivate *this_00;
  QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
  *pQVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->d).d.ptr;
  if (this_00 == (QProcessEnvironmentPrivate *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) goto LAB_003cbe9b;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&defaultValue->d);
  }
  else {
    QProcessEnvironmentPrivate::prepareName((Key *)&QStack_48,this_00,name);
    cVar2 = QMap<QByteArray,_QProcEnvValue>::find(&this_00->vars,(QByteArray *)&QStack_48);
    QArrayDataPointer<char>::~QArrayDataPointer(&QStack_48);
    pQVar1 = (((this->d).d.ptr)->vars).d.d.ptr;
    cVar3._M_node = (_Base_ptr)((long)&(pQVar1->m)._M_t._M_impl + 8);
    if (pQVar1 == (QMapData<std::map<QByteArray,_QProcEnvValue,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QProcEnvValue>_>_>_>
                   *)0x0) {
      cVar3._M_node = (_Base_ptr)0x0;
    }
    if (cVar2.i._M_node == (const_iterator)cVar3._M_node) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&defaultValue->d);
    }
    else {
      QProcEnvValue::string(__return_storage_ptr__,(QProcEnvValue *)((long)cVar2.i._M_node + 0x38));
    }
    if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
LAB_003cbe9b:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString QProcessEnvironment::value(const QString &name, const QString &defaultValue) const
{
    if (!d)
        return defaultValue;

    const auto it = d->vars.constFind(d->prepareName(name));
    if (it == d->vars.constEnd())
        return defaultValue;

    return d->valueToString(it.value());
}